

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp8_dec.c
# Opt level: O3

int VP8DecodeMB(VP8Decoder *dec,VP8BitReader *token_br)

{
  byte bVar1;
  int iVar2;
  VP8FInfo VVar3;
  VP8MB *pVVar4;
  VP8FInfo *pVVar5;
  bool bVar6;
  bool bVar7;
  VP8MBData *pVVar8;
  bool bVar9;
  uint8_t uVar10;
  int iVar11;
  uint uVar12;
  VP8MBData *pVVar13;
  uint uVar14;
  uint uVar15;
  ulong uVar16;
  int iVar17;
  byte bVar18;
  uint uVar19;
  uint uVar20;
  byte bVar21;
  uint uVar22;
  uint uVar23;
  uint uVar24;
  int iVar25;
  int16_t *piVar26;
  VP8BandProbas *(*papVVar27) [17];
  bool bVar28;
  VP8MBData *__s;
  long lVar29;
  int16_t dc [16];
  short local_58 [20];
  
  pVVar4 = dec->mb_info;
  iVar2 = dec->mb_x;
  __s = dec->mb_data + iVar2;
  if ((dec->use_skip_proba == 0) || (__s->skip == '\0')) {
    bVar1 = __s->segment;
    iVar25 = 0;
    memset(__s,0,0x300);
    if (__s->is_i4x4 == '\0') {
      local_58[8] = 0;
      local_58[9] = 0;
      local_58[10] = 0;
      local_58[0xb] = 0;
      local_58[0xc] = 0;
      local_58[0xd] = 0;
      local_58[0xe] = 0;
      local_58[0xf] = 0;
      local_58[0] = 0;
      local_58[1] = 0;
      local_58[2] = 0;
      local_58[3] = 0;
      local_58[4] = 0;
      local_58[5] = 0;
      local_58[6] = 0;
      local_58[7] = 0;
      iVar25 = (*GetCoeffs)(token_br,(dec->proba).bands_ptr[1],
                            (uint)pVVar4[-1].nz_dc + (uint)pVVar4[iVar2].nz_dc,
                            dec->dqm[bVar1].y2_mat,0,local_58);
      pVVar4[-1].nz_dc = 0 < iVar25;
      pVVar4[iVar2].nz_dc = 0 < iVar25;
      if (iVar25 < 2) {
        uVar16 = 0xfffffffffffffff0;
        do {
          __s->coeffs[uVar16 + 0x10] = (int16_t)((int)local_58[0] + 3U >> 3);
          uVar16 = uVar16 + 0x10;
        } while (uVar16 < 0xf0);
      }
      else {
        (*VP8TransformWHT)(local_58,__s->coeffs);
      }
      papVVar27 = (dec->proba).bands_ptr;
      iVar25 = 1;
    }
    else {
      papVVar27 = (dec->proba).bands_ptr + 3;
    }
    bVar18 = pVVar4[iVar2].nz & 0xf;
    bVar21 = pVVar4[-1].nz & 0xf;
    uVar12 = 0;
    iVar17 = 0;
    pVVar8 = __s;
    do {
      pVVar13 = pVVar8;
      bVar9 = (bool)(bVar21 & 1);
      lVar29 = 0;
      uVar24 = 0;
      do {
        iVar11 = (*GetCoeffs)(token_br,*papVVar27,(uint)(bVar18 & 1) + (uint)bVar9,
                              dec->dqm[bVar1].y1_mat,iVar25,
                              (int16_t *)((long)pVVar13->coeffs + lVar29));
        bVar9 = iVar25 < iVar11;
        bVar18 = bVar18 >> 1 | bVar9 << 7;
        uVar20 = (uint)(*(short *)((long)pVVar13->coeffs + lVar29) != 0);
        if (1 < iVar11) {
          uVar20 = 2;
        }
        if (3 < iVar11) {
          uVar20 = 3;
        }
        uVar24 = uVar20 + uVar24 * 4;
        lVar29 = lVar29 + 0x20;
      } while ((int)lVar29 != 0x80);
      bVar18 = bVar18 >> 4;
      bVar21 = bVar9 << 7 | bVar21 >> 1;
      uVar12 = uVar12 << 8 | uVar24;
      iVar17 = iVar17 + 1;
      pVVar8 = (VP8MBData *)((long)pVVar13->coeffs + lVar29);
    } while (iVar17 != 4);
    uVar22 = (uint)bVar18;
    uVar20 = (uint)(bVar21 >> 4);
    piVar26 = (int16_t *)((long)pVVar13->coeffs + lVar29);
    uVar24 = 0;
    bVar18 = 0;
    bVar9 = true;
    do {
      bVar7 = bVar9;
      uVar19 = (uint)(pVVar4[iVar2].nz >> (bVar18 | 4));
      uVar23 = (uint)(pVVar4[-1].nz >> (bVar18 | 4));
      iVar25 = 0;
      bVar9 = true;
      do {
        bVar6 = bVar9;
        uVar14 = uVar23 & 1;
        bVar9 = true;
        do {
          bVar28 = bVar9;
          iVar17 = (*GetCoeffs)(token_br,(dec->proba).bands_ptr[2],(uVar19 & 1) + uVar14,
                                dec->dqm[bVar1].uv_mat,0,piVar26);
          uVar14 = (uint)(0 < iVar17);
          uVar19 = (uint)(0 < iVar17) * 8 | uVar19 >> 1;
          uVar15 = (uint)(*piVar26 != 0);
          if (1 < iVar17) {
            uVar15 = 2;
          }
          if (3 < iVar17) {
            uVar15 = 3;
          }
          iVar25 = uVar15 + iVar25 * 4;
          piVar26 = piVar26 + 0x10;
          bVar9 = false;
        } while (bVar28);
        uVar19 = uVar19 >> 2;
        uVar14 = uVar23 >> 1;
        uVar15 = (uint)(0 < iVar17) << 5;
        uVar23 = uVar15 | uVar14;
        bVar9 = false;
      } while (bVar6);
      uVar24 = uVar24 | iVar25 << bVar18 * '\x04';
      uVar22 = uVar22 | (uVar19 << 4) << bVar18;
      uVar20 = uVar20 | (uVar15 | uVar14 & 0x70) << bVar18;
      bVar18 = 2;
      bVar9 = false;
    } while (bVar7);
    pVVar4[iVar2].nz = (uint8_t)uVar22;
    pVVar4[-1].nz = (uint8_t)uVar20;
    __s->non_zero_y = uVar12;
    __s->non_zero_uv = uVar24;
    if ((uVar24 & 0xaaaa) == 0) {
      uVar10 = (uint8_t)dec->dqm[bVar1].dither;
    }
    else {
      uVar10 = '\0';
    }
    __s->dither = uVar10;
    bVar9 = uVar24 != 0 || uVar12 != 0;
  }
  else {
    pVVar4[iVar2].nz = '\0';
    pVVar4[-1].nz = '\0';
    if (__s->is_i4x4 == '\0') {
      pVVar4[iVar2].nz_dc = '\0';
      pVVar4[-1].nz_dc = '\0';
    }
    __s->dither = '\0';
    __s->non_zero_y = 0;
    __s->non_zero_uv = 0;
    bVar9 = false;
  }
  if (0 < dec->filter_type) {
    pVVar5 = dec->f_info;
    iVar2 = dec->mb_x;
    VVar3 = dec->fstrengths[__s->segment][__s->is_i4x4];
    pVVar5[iVar2] = VVar3;
    pVVar5[iVar2].f_inner = bVar9 | VVar3.f_inner;
  }
  return (int)(token_br->eof == 0);
}

Assistant:

int VP8DecodeMB(VP8Decoder* const dec, VP8BitReader* const token_br) {
  VP8MB* const left = dec->mb_info - 1;
  VP8MB* const mb = dec->mb_info + dec->mb_x;
  VP8MBData* const block = dec->mb_data + dec->mb_x;
  int skip = dec->use_skip_proba ? block->skip : 0;

  if (!skip) {
    skip = ParseResiduals(dec, mb, token_br);
  } else {
    left->nz = mb->nz = 0;
    if (!block->is_i4x4) {
      left->nz_dc = mb->nz_dc = 0;
    }
    block->non_zero_y = 0;
    block->non_zero_uv = 0;
    block->dither = 0;
  }

  if (dec->filter_type > 0) {  // store filter info
    VP8FInfo* const finfo = dec->f_info + dec->mb_x;
    *finfo = dec->fstrengths[block->segment][block->is_i4x4];
    finfo->f_inner |= !skip;
  }

  return !token_br->eof;
}